

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::mouseReleaseEvent(QLineEdit *this,QMouseEvent *e)

{
  byte bVar1;
  QLineEditPrivate *this_00;
  QWidgetData *pQVar2;
  QWidget *this_01;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  QStyle *pQVar7;
  EVP_PKEY_CTX *src;
  long in_FS_OFFSET;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 local_40;
  QPoint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  bVar4 = QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  if (!bVar4) {
    if ((*(int *)(e + 0x40) == 1) && ((this_00->dndTimer).m_id != Invalid)) {
      QBasicTimer::stop();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWidgetLineControl::deselect
                  (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
        return;
      }
      goto LAB_00419b9c;
    }
    QGuiApplication::clipboard();
    cVar5 = QClipboard::supportsSelection();
    if (cVar5 != '\0') {
      if (*(int *)(e + 0x40) == 1) {
        QWidgetLineControl::copy((QWidgetLineControl *)this_00->control,(EVP_PKEY_CTX *)0x1,src);
      }
      else if ((*(int *)(e + 0x40) == 4) && ((*(ushort *)&this_00->control->field_0x50 & 4) == 0)) {
        QWidgetLineControl::deselect
                  (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
        QWidgetLineControl::paste((QWidgetLineControl *)this_00->control,Selection);
      }
    }
    if ((*(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
      pQVar2 = (this->super_QWidget).data;
      local_30 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                          (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      local_38.xp.m_i = 0;
      local_38.yp.m_i = 0;
      auVar10 = QEventPoint::position();
      dVar9 = (double)((ulong)auVar10._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._0_8_;
      bVar4 = 2147483647.0 < dVar9;
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      dVar8 = (double)((ulong)auVar10._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
              auVar10._8_8_;
      bVar3 = 2147483647.0 < dVar8;
      if (dVar8 <= -2147483648.0) {
        dVar8 = -2147483648.0;
      }
      local_40 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar3 & (ulong)dVar8),
                          (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                       ~-(ulong)bVar4 & (ulong)dVar9));
      cVar5 = QRect::contains(&local_38,SUB81(&local_40,0));
      if ((cVar5 != '\0') && (*(int *)(e + 0x40) == 1)) {
        bVar1 = this_00->field_0x27c;
        this_01 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
        bVar4 = QApplication::autoSipEnabled(QCoreApplication::self);
        if (bVar4) {
          pQVar7 = QWidget::style(this_01);
          iVar6 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x5f,0,this_01,0);
          if (((bVar1 & 0x10) == 0) || (iVar6 == 1)) {
            QGuiApplication::inputMethod();
            QInputMethod::show();
          }
        }
      }
    }
    this_00->field_0x27c = this_00->field_0x27c & 0xef;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00419b9c:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseReleaseEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);
    if (d->sendMouseEventToInputContext(e))
        return;
#if QT_CONFIG(draganddrop)
    if (e->button() == Qt::LeftButton) {
        if (d->dndTimer.isActive()) {
            d->dndTimer.stop();
            deselect();
            return;
        }
    }
#endif
#ifndef QT_NO_CLIPBOARD
    if (QGuiApplication::clipboard()->supportsSelection()) {
        if (e->button() == Qt::LeftButton) {
            d->control->copy(QClipboard::Selection);
        } else if (!d->control->isReadOnly() && e->button() == Qt::MiddleButton) {
            deselect();
            d->control->paste(QClipboard::Selection);
        }
    }
#endif

    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}